

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

QSize __thiscall QSidebar::sizeHint(QSidebar *this)

{
  int iVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  QSize QVar4;
  QSize QVar5;
  long in_FS_OFFSET;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QVar4 = QAbstractScrollArea::sizeHint((QAbstractScrollArea *)this);
      return QVar4;
    }
  }
  else {
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_38,pQVar3,0,0);
    QVar4 = QAbstractItemView::sizeHintForIndex((QAbstractItemView *)this,&local_38);
    iVar1 = QFrame::frameWidth((QFrame *)this);
    iVar2 = QFrame::frameWidth((QFrame *)this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QVar5.wd.m_i = QVar4.wd.m_i.m_i + iVar1 * 2;
      QVar5.ht.m_i = QVar4.ht.m_i.m_i + iVar2 * 2;
      return QVar5;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSize QSidebar::sizeHint() const
{
    if (model())
        return QListView::sizeHintForIndex(model()->index(0, 0)) + QSize(2 * frameWidth(), 2 * frameWidth());
    return QListView::sizeHint();
}